

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_c1a4f9::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  optional<CFeeRate> *this_00;
  CAmount *pCVar1;
  size_t *psVar2;
  bool submitted_in_package;
  long lVar3;
  element_type *peVar4;
  int64_t iVar5;
  CTransactionRef *tx;
  CTransaction *tx_00;
  CTxMemPool *pCVar6;
  uint64_t mempool_sequence;
  ValidationSignals *this_01;
  CTxMemPoolEntry *this_02;
  string_view source_file;
  string_view source_file_00;
  PackageValidationState state;
  TxValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  PackageValidationState state_04;
  TxValidationState state_05;
  PackageValidationState state_06;
  PackageValidationState state_07;
  TxValidationState state_08;
  PackageValidationState state_09;
  PackageValidationState state_10;
  TxValidationState state_11;
  TxValidationState state_12;
  TxValidationState state_13;
  PackageValidationState state_14;
  PackageValidationState state_15;
  pointer __first;
  setEntries *psVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool chainstate_is_current;
  bool has_no_mempool_parents;
  int32_t iVar11;
  pointer __result;
  pointer pWVar12;
  Workspace *pWVar13;
  pointer pWVar14;
  ValidationState<TxValidationResult> *pVVar15;
  CFeeRate *pCVar16;
  pointer pWVar17;
  long lVar18;
  size_type __n;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *replaced_txns;
  pointer __n_00;
  Logger *pLVar19;
  _Base_ptr p_Var20;
  _Tp_alloc_type *p_Var21;
  Limits *limits;
  size_t __n_01;
  Workspace *__args;
  Workspace *__args_00;
  size_t __n_02;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *pWVar22;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  iterator __end1;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *this_03;
  pointer pWVar23;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  __it;
  ValidationState<PackageValidationResult> *pVVar24;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it_00;
  pointer psVar25;
  string *this_04;
  string *psVar26;
  CFeeRate relay_fee;
  Workspace *ws;
  _Tp_alloc_type *this_05;
  pointer pWVar27;
  pointer psVar28;
  long lVar29;
  _Rb_tree<_270907ca_> *this_06;
  ulong uVar30;
  shared_ptr<const_CTransaction> *psVar31;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var32;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  _Var33;
  MemPoolAccept *this_07;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  string_view str;
  initializer_list<transaction_identifier<true>_> __l_01;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  uint in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  uint in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  uint in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  undefined4 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  undefined8 in_stack_fffffffffffff5a8;
  MemPoolAccept *pMVar34;
  undefined8 in_stack_fffffffffffff5b0;
  SubPackageState *nFeePaid;
  undefined4 in_stack_fffffffffffff5b8;
  uint height;
  undefined4 in_stack_fffffffffffff5bc;
  undefined4 uVar35;
  undefined8 in_stack_fffffffffffff5c8;
  PackageMempoolAcceptResult *pPVar36;
  CFeeRate local_a10;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  local_9e8;
  CFeeRate package_feerate_1;
  CFeeRate parent_feerate;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  ValidationState<PackageValidationResult> local_9a8;
  ValidationState<PackageValidationResult> local_960;
  ValidationState<PackageValidationResult> local_918;
  ValidationState<PackageValidationResult> local_8d0;
  ValidationState<TxValidationResult> local_888;
  ValidationState<PackageValidationResult> local_840;
  ValidationState<TxValidationResult> local_7f8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  ValidationState<PackageValidationResult> local_6d0;
  TxValidationState placeholder_state;
  ValidationState<PackageValidationResult> local_640;
  ValidationState<PackageValidationResult> local_5f8;
  ValidationState<TxValidationResult> local_5b0;
  ValidationState<PackageValidationResult> local_568;
  ValidationState<TxValidationResult> local_520;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  ValidationState<PackageValidationResult> local_4a8;
  PackageValidationState package_state;
  Result<void> result;
  string local_1d8;
  string local_1b8;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids_1;
  ValidationState<TxValidationResult> local_170;
  ValidationState<TxValidationResult> local_128;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  undefined1 local_b8;
  __index_type local_a0;
  string local_98;
  Limits local_78;
  CFeeRate effective_feerate_1;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  package_state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  p_Var21 = (_Tp_alloc_type *)0x0;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  bVar8 = IsWellFormedPackage(txns,&package_state,true);
  if (bVar8) {
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Workspace *)0x0;
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (Workspace *)0x0;
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Workspace *)0x0;
    psVar25 = (txns->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar28 = (txns->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    this_03 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)((long)psVar28 - (long)psVar25 >> 4);
    if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x38e38e38e38e38 < this_03) {
LAB_0037c730:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        std::__throw_length_error("vector::reserve");
LAB_0037c753:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          std::__throw_bad_optional_access();
        }
      }
      goto LAB_0037d2dc;
    }
    __result = local_9e8.
               super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pWVar13 = local_9e8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pWVar22 = local_9e8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pWVar17 = local_9e8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar28 != psVar25) {
      __result = std::
                 _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                 ::_M_allocate(this_03,(size_t)psVar25);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,__result,p_Var21);
      std::
      _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                       *)0x0,(pointer)0x0,__n_01);
      local_9e8.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_03;
      psVar25 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar28 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pWVar13 = __result;
      pWVar22 = local_9e8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pWVar17 = __result;
      local_9e8.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = __result;
    }
    for (; local_9e8.
           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ._M_impl.super__Vector_impl_data._M_start = pWVar17, psVar25 != psVar28;
        psVar25 = psVar25 + 1) {
      Workspace::Workspace((Workspace *)&result,psVar25);
      if (__result == pWVar22) {
        lVar29 = (long)pWVar22 - (long)pWVar13;
        if (lVar29 == 0x7ffffffffffffe00) {
          local_9e8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_start = pWVar13;
          local_9e8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish = __result;
          local_9e8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar22;
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) goto LAB_0037d2dc;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_0037c730;
        }
        pWVar12 = (pointer)(lVar29 / 0x240);
        in_stack_fffffffffffff5b8 = SUB84(pWVar13,0);
        in_stack_fffffffffffff5bc = (undefined4)((ulong)pWVar13 >> 0x20);
        pWVar17 = pWVar12;
        if (pWVar22 == pWVar13) {
          pWVar17 = (pointer)&DAT_00000001;
        }
        p_Var21 = (_Tp_alloc_type *)
                  (&(pWVar17->m_conflicts)._M_t._M_impl.field_0x0 +
                  (long)&(pWVar12->m_conflicts)._M_t._M_impl.field_0x0);
        if ((_Tp_alloc_type *)0x38e38e38e38e37 < p_Var21) {
          p_Var21 = (_Tp_alloc_type *)0x38e38e38e38e38;
        }
        this_05 = (_Tp_alloc_type *)0x38e38e38e38e38;
        if (!CARRY8((ulong)pWVar17,(ulong)pWVar12)) {
          this_05 = p_Var21;
        }
        pWVar13 = std::
                  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ::_M_allocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                                 *)this_05,(size_t)pWVar22);
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)(lVar29 + (long)pWVar13),(Workspace *)&result,__args_00);
        __first = (pointer)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8);
        pWVar14 = std::
                  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ::_S_relocate(__first,__result,pWVar13,p_Var21);
        __result = std::
                   vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ::_S_relocate(__result,__result,pWVar14 + 1,(_Tp_alloc_type *)0x240);
        std::
        _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                         *)__first,pWVar12,__n_02);
        pWVar22 = pWVar13 + (long)this_05;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)__result,(Workspace *)&result,__args);
        __result = __result + 1;
      }
      Workspace::~Workspace((Workspace *)&result);
      pWVar17 = local_9e8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &results._M_t._M_impl.super__Rb_tree_header._M_header;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_07 = this;
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = pWVar13;
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = __result;
    local_9e8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar22;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock8,&this->m_pool->cs,"m_pool.cs",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
               ,0x5f1,false);
    this_00 = &args->m_client_maxfeerate;
    for (pVVar15 = &(pWVar13->m_state).super_ValidationState<TxValidationResult>;
        pWVar17 = local_9e8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (pointer)&pVVar15[-3].m_reject_reason != __result; pVVar15 = pVVar15 + 8) {
      bVar8 = PreChecks(this_07,args,(Workspace *)&pVVar15[-3].m_reject_reason);
      if (!bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&local_128);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&result);
        lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
        ValidationState<TxValidationResult>::ValidationState(&local_520,pVVar15);
        state_00.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
        state_00.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             in_stack_fffffffffffff590;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             in_stack_fffffffffffff594;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_ =
             in_stack_fffffffffffff598;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_ =
             in_stack_fffffffffffff59c;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pWVar22;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_ =
             in_stack_fffffffffffff5b8;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_ =
             in_stack_fffffffffffff5bc;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_00);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        ValidationState<TxValidationResult>::~ValidationState(&local_520);
        ValidationState<PackageValidationResult>::ValidationState
                  (&local_568,&package_state.super_ValidationState<PackageValidationResult>);
        state_01.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c
        ;
        state_01.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = in_stack_fffffffffffff590;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = in_stack_fffffffffffff594;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = in_stack_fffffffffffff598;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = in_stack_fffffffffffff59c;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             this_07;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pWVar22;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = in_stack_fffffffffffff5b8;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = in_stack_fffffffffffff5bc;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_01,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&local_568);
        pVVar24 = &local_568;
LAB_0037b10a:
        ValidationState<PackageValidationResult>::~ValidationState(pVVar24);
        goto LAB_0037c0bf;
      }
      if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == true) {
        CFeeRate::CFeeRate((CFeeRate *)&result,(CAmount *)&pVVar15[-1].m_debug_message,
                           *(uint32_t *)&pVVar15[-1].m_reject_reason.field_2);
        pCVar16 = std::optional<CFeeRate>::value(this_00);
        if (pCVar16->nSatoshisPerK <
            (long)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"max feerate exceeded",(allocator<char> *)&err_string);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"",(allocator<char> *)&local_128);
          ValidationState<TxValidationResult>::Invalid
                    (pVVar15,TX_MEMPOOL_POLICY,(string *)&result,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"",(allocator<char> *)&local_128);
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                     (string *)&result,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&result);
          lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_5b0,pVVar15);
          state_03.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
          state_03.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
               = in_stack_fffffffffffff590;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
               = in_stack_fffffffffffff594;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_
               = in_stack_fffffffffffff598;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_
               = in_stack_fffffffffffff59c;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07
          ;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)pWVar22;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_
               = in_stack_fffffffffffff5b8;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_
               = in_stack_fffffffffffff5bc;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)args;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               __return_storage_ptr__;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_03);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_5b0);
          ValidationState<PackageValidationResult>::ValidationState
                    (&local_5f8,&package_state.super_ValidationState<PackageValidationResult>);
          state_04.super_ValidationState<PackageValidationResult>.m_result =
               in_stack_fffffffffffff58c;
          state_04.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588
          ;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _0_4_ = in_stack_fffffffffffff590;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
          _4_4_ = in_stack_fffffffffffff594;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _0_4_ = in_stack_fffffffffffff598;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _4_4_ = in_stack_fffffffffffff59c;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               this_07;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)pWVar22;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _0_4_ = in_stack_fffffffffffff5b8;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
          _4_4_ = in_stack_fffffffffffff5bc;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)args;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               __return_storage_ptr__;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_04,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)&local_5f8);
          pVVar24 = &local_5f8;
          goto LAB_0037b10a;
        }
      }
      CCoinsViewMemPool::PackageAddTransaction
                (&this->m_viewmempool,
                 (CTransactionRef *)pVVar15[-1].m_debug_message.field_2._M_allocated_capacity);
    }
    for (pWVar12 = local_9e8.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar23 = local_9e8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        pWVar27 = local_9e8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start, pWVar12 != pWVar17;
        pWVar12 = pWVar12 + 1) {
      PackageTRUCChecks_abi_cxx11_(&err,pWVar12->m_ptx,pWVar12->m_vsize,txns,&pWVar12->m_ancestors);
      if (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"TRUC-violation",(allocator<char> *)&err_string);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) goto LAB_0037c753;
        pPVar36 = __return_storage_ptr__;
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&result);
        ValidationState<PackageValidationResult>::ValidationState
                  (&local_640,&package_state.super_ValidationState<PackageValidationResult>);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
        state_02.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c
        ;
        state_02.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = in_stack_fffffffffffff590;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = in_stack_fffffffffffff594;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = in_stack_fffffffffffff598;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = in_stack_fffffffffffff59c;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             this_07;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pWVar22;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = in_stack_fffffffffffff5b8;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = in_stack_fffffffffffff5bc;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             pPVar36;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
             result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_02,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&local_640);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)&result);
        ValidationState<PackageValidationResult>::~ValidationState(&local_640);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&err);
        goto LAB_0037c0bf;
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&err);
    }
    lVar29 = 0;
    for (pWVar17 = local_9e8.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar17 !=
        local_9e8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish; pWVar17 = pWVar17 + 1) {
      lVar29 = lVar29 + pWVar17->m_vsize;
    }
    (this_07->m_subpackage).m_total_vsize = lVar29;
    lVar18 = 0;
    for (pWVar17 = local_9e8.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar17 !=
        local_9e8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish; pWVar17 = pWVar17 + 1) {
      lVar18 = lVar18 + pWVar17->m_modified_fees;
    }
    nFeePaid = &this_07->m_subpackage;
    (this_07->m_subpackage).m_total_modified_fees = lVar18;
    CFeeRate::CFeeRate(&package_feerate,&nFeePaid->m_total_modified_fees,(uint32_t)lVar29);
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = ((long)pWVar23 - (long)pWVar27) / 0x240;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    reserve(&all_package_wtxids,__n);
    pWVar13 = extraout_RDX;
    for (pWVar17 = pWVar27; pWVar17 != pWVar23; pWVar17 = pWVar17 + 1) {
      peVar4 = (pWVar17->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
      emplace_back<transaction_identifier<true>>
                ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                  *)&all_package_wtxids,(transaction_identifier<true> *)&result);
      pWVar13 = extraout_RDX_00;
    }
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   field_2;
    placeholder_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    placeholder_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
    ;
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf
    [0] = '\0';
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   field_2;
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0
    ;
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf
    [0] = '\0';
    if ((args->m_package_feerates != true) ||
       (bVar8 = CheckFeeRate(this_07,(this_07->m_subpackage).m_total_vsize,
                             (this_07->m_subpackage).m_total_modified_fees,&placeholder_state),
       pWVar13 = extraout_RDX_01, bVar8)) {
      __it_00._M_current =
           (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      psVar25 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      height = (uint)psVar25;
      uVar35 = (undefined4)((ulong)psVar25 >> 0x20);
      uVar30 = (long)psVar25 - (long)__it_00._M_current;
      pWVar17 = pWVar27;
      if (0x10 < uVar30) {
        iVar5 = (this_07->m_subpackage).m_total_vsize;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = this_07;
        for (lVar29 = (long)uVar30 >> 6; _Var32._M_current = __it_00._M_current, 0 < lVar29;
            lVar29 = lVar29 + -1) {
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it_00);
          if (bVar8) {
LAB_0037b2e0:
            psVar31 = (shared_ptr<const_CTransaction> *)CONCAT44(uVar35,height);
            goto LAB_0037b2e5;
          }
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it_00._M_current + 1);
          _Var32._M_current = __it_00._M_current + 1;
          if (bVar8) goto LAB_0037b2e0;
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it_00._M_current + 2);
          _Var32._M_current = __it_00._M_current + 2;
          if (bVar8) goto LAB_0037b2e0;
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it_00._M_current + 3);
          _Var32._M_current = __it_00._M_current + 3;
          if (bVar8) goto LAB_0037b2e0;
          __it_00._M_current = __it_00._M_current + 4;
          uVar30 = uVar30 - 0x40;
        }
        lVar29 = (long)uVar30 >> 4;
        if (lVar29 == 1) {
          psVar31 = (shared_ptr<const_CTransaction> *)CONCAT44(uVar35,height);
LAB_0037c143:
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it_00);
          _Var32._M_current = __it_00._M_current;
          if (!bVar8) {
            _Var32._M_current = psVar31;
          }
LAB_0037b2e5:
          if (_Var32._M_current != psVar31) {
            __assert_fail("std::all_of(txns.cbegin(), txns.cend(), [this](const auto& tx) { return !m_pool.exists(GenTxid::Txid(tx->GetHash()));})"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x479,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
        }
        else {
          if (lVar29 == 2) {
            psVar31 = (shared_ptr<const_CTransaction> *)CONCAT44(uVar35,height);
LAB_0037c124:
            bVar8 = __gnu_cxx::__ops::
                    _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                    ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                  *)&result,__it_00);
            _Var32._M_current = __it_00._M_current;
            if (!bVar8) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_0037c143;
            }
            goto LAB_0037b2e5;
          }
          if (lVar29 == 3) {
            bVar8 = __gnu_cxx::__ops::
                    _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                    ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                  *)&result,__it_00);
            psVar31 = (shared_ptr<const_CTransaction> *)CONCAT44(uVar35,height);
            if (!bVar8) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_0037c124;
            }
            goto LAB_0037b2e5;
          }
        }
        if ((long)(txns->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(txns->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4 != __n) {
          __assert_fail("txns.size() == workspaces.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ,0x47b,
                        "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                       );
        }
        CTxMemPool::CheckPackageLimits(&result,this_07->m_pool,txns,iVar5);
        if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_string,"package-mempool-limits",(allocator<char> *)&local_128);
          util::ErrorString<void>((bilingual_str *)&err,&result);
          bVar8 = ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_POLICY,(string *)&err_string,(string *)&err);
          bilingual_str::~bilingual_str((bilingual_str *)&err);
          this_04 = (string *)&err_string;
          goto LAB_0037b4cf;
        }
        if ((this_07->m_subpackage).m_rbf == true) {
          if (((long)pWVar23 - (long)pWVar27 == 0x480) &&
             (bVar8 = IsChildWithParents(txns), pWVar13 = pWVar27, bVar8)) {
LAB_0037b368:
            if (pWVar13 != pWVar23) goto code_r0x0037b371;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ =
                 (long)&err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 8;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length._0_4_ = 0;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = 0;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ = err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._24_8_;
            for (; pWVar17 = local_9e8.
                             super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                             ._M_impl.super__Vector_impl_data._M_start, pWVar27 != pWVar23;
                pWVar27 = pWVar27 + 1) {
              std::_Rb_tree<$270907ca$>::_M_merge_unique<CompareIteratorByHash>
                        ((_Rb_tree<_270907ca_> *)&err,&(pWVar27->m_iters_conflicting)._M_t);
            }
            psVar7 = &(this_07->m_subpackage).m_all_conflicts;
            GetEntriesForConflicts_abi_cxx11_
                      (&err_string,
                       ((local_9e8.
                         super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       this_07->m_pool,(setEntries *)&err,psVar7);
            bVar8 = err_string.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged;
            if (err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"package RBF failed: too many potential replacements",
                         (allocator<char> *)&local_170);
              bVar10 = ValidationState<PackageValidationResult>::Invalid
                                 (&package_state.super_ValidationState<PackageValidationResult>,
                                  PCKG_POLICY,(string *)&local_128,(string *)&err_string);
              pWVar27 = (pointer)(ulong)bVar10;
              std::__cxx11::string::~string((string *)&local_128);
            }
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&err_string);
            if (bVar8 == false) {
              pMVar34 = this_07;
              for (p_Var20 = (this_07->m_subpackage).m_all_conflicts._M_t._M_impl.
                             super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var20 !=
                  &(this_07->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
                  p_Var20 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20)) {
                this_02 = *(CTxMemPoolEntry **)(p_Var20 + 1);
                pCVar1 = &(this_07->m_subpackage).m_conflicting_fees;
                *pCVar1 = *pCVar1 + this_02->m_modified_fee;
                iVar11 = CTxMemPoolEntry::GetTxSize(this_02);
                psVar2 = &(this_07->m_subpackage).m_conflicting_size;
                *psVar2 = *psVar2 + (long)iVar11;
              }
              relay_fee.nSatoshisPerK =
                   (pMVar34->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK;
              PaysForRBF_abi_cxx11_
                        (&err_string,(pMVar34->m_subpackage).m_conflicting_fees,
                         (pMVar34->m_subpackage).m_total_modified_fees,
                         (pMVar34->m_subpackage).m_total_vsize,relay_fee,
                         &((((pWVar17[1].m_ptx)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash).m_wrapped);
              this_07 = pMVar34;
              if (err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged == true) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_128,"package RBF failed: insufficient anti-DoS fees",
                           (allocator<char> *)&local_170);
                bVar8 = ValidationState<PackageValidationResult>::Invalid
                                  (&package_state.super_ValidationState<PackageValidationResult>,
                                   PCKG_POLICY,(string *)&local_128,(string *)&err_string);
                pWVar27 = (pointer)(ulong)bVar8;
                std::__cxx11::string::~string((string *)&local_128);
                this_07 = pMVar34;
              }
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&err_string);
              if (err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged == false) {
                CFeeRate::CFeeRate(&parent_feerate,&pWVar17->m_modified_fees,
                                   (uint32_t)pWVar17->m_vsize);
                CFeeRate::CFeeRate(&package_feerate_1,&nFeePaid->m_total_modified_fees,
                                   (uint32_t)(this_07->m_subpackage).m_total_vsize);
                if (parent_feerate.nSatoshisPerK < package_feerate_1.nSatoshisPerK) {
                  ImprovesFeerateDiagram_abi_cxx11_
                            ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&err_string,this_07->m_pool,(setEntries *)&err,psVar7,
                             (this_07->m_subpackage).m_total_modified_fees,
                             (this_07->m_subpackage).m_total_vsize);
                  if (local_b8 == '\x01') {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_128,"package RBF failed: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&err_string.
                                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ._M_payload + 8));
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_170,"",(allocator<char> *)&effective_feerate_1);
                    bVar8 = ValidationState<PackageValidationResult>::Invalid
                                      (&package_state.super_ValidationState<PackageValidationResult>
                                       ,PCKG_POLICY,(string *)&local_128,(string *)&local_170);
                    pWVar27 = (pointer)(ulong)bVar8;
                    std::__cxx11::string::~string((string *)&local_170);
                    std::__cxx11::string::~string((string *)&local_128);
                  }
                  std::
                  _Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_reset((_Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&err_string);
                  if (local_b8 == '\0') {
                    bVar8 = ::LogAcceptCategory(TXPACKAGES,Debug);
                    pWVar27 = (pointer)&DAT_00000001;
                    if (bVar8) {
                      base_blob<256u>::ToString_abi_cxx11_
                                (&local_98,
                                 (base_blob<256u> *)
                                 &((((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&all_package_wtxids_1,
                                 (base_blob<256u> *)
                                 &((((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->m_witness_hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                (&local_1b8,
                                 (base_blob<256u> *)
                                 &((txns->
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                (&local_1d8,
                                 (base_blob<256u> *)
                                 &((txns->
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_witness_hash);
                      pLVar19 = LogInstance();
                      bVar8 = BCLog::Logger::Enabled(pLVar19);
                      if (bVar8) {
                        err_string.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p =
                             (_Alloc_hider)
                             ((long)&err_string.
                                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._M_payload + 0x10);
                        err_string.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length = 0;
                        err_string.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_1_ = 0;
                        tinyformat::
                        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                  ((string *)&local_128,
                                   (tinyformat *)
                                   "package RBF checks passed: parent %s (wtxid=%s), child %s (wtxid=%s)\n"
                                   ,(char *)&local_98,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&all_package_wtxids_1,&local_1b8,&local_1d8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588))
                        ;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&err_string,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_128);
                        std::__cxx11::string::~string((string *)&local_128);
                        pLVar19 = LogInstance();
                        local_128.m_mode = 0x57;
                        local_128.m_result = TX_RESULT_UNSET;
                        local_128.m_reject_reason._M_dataplus._M_p =
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ;
                        in_stack_fffffffffffff588 = 0x57;
                        in_stack_fffffffffffff58c = 0;
                        in_stack_fffffffffffff590 = 0x6d76f9;
                        in_stack_fffffffffffff594 = 0;
                        in_stack_fffffffffffff5a0 = 1;
                        in_stack_fffffffffffff598 = 0x10000000;
                        in_stack_fffffffffffff59c = 0;
                        source_file_00._M_str._0_4_ = 0x6d76f9;
                        source_file_00._M_len = 0x57;
                        source_file_00._M_str._4_4_ = 0;
                        str_00._M_str =
                             (char *)err_string.
                                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._M_payload._M_value._M_dataplus._M_p;
                        str_00._M_len =
                             err_string.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_string_length;
                        logging_function_00._M_str = "PackageMempoolChecks";
                        logging_function_00._M_len = 0x14;
                        BCLog::Logger::LogPrintStr
                                  (pLVar19,str_00,logging_function_00,source_file_00,0x4c9,
                                   TXPACKAGES,Debug);
                        std::__cxx11::string::~string((string *)&err_string);
                      }
                      std::__cxx11::string::~string((string *)&local_1d8);
                      std::__cxx11::string::~string((string *)&local_1b8);
                      std::__cxx11::string::~string((string *)&all_package_wtxids_1);
                      psVar26 = &local_98;
                      goto LAB_0037c6de;
                    }
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err_string,
                             "package RBF failed: package feerate is less than or equal to parent feerate"
                             ,(allocator<char> *)&all_package_wtxids_1);
                  local_78.ancestor_count._0_4_ = 3;
                  CFeeRate::ToString_abi_cxx11_
                            ((string *)&local_170,&package_feerate_1,(FeeEstimateMode *)&local_78);
                  local_98._M_dataplus._M_p._0_4_ = 3;
                  CFeeRate::ToString_abi_cxx11_
                            ((string *)&effective_feerate_1,&parent_feerate,
                             (FeeEstimateMode *)&local_98);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&local_128,
                             (tinyformat *)"package feerate %s <= parent feerate is %s",
                             (char *)&local_170,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &effective_feerate_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             relay_fee.nSatoshisPerK);
                  bVar8 = ValidationState<PackageValidationResult>::Invalid
                                    (&package_state.super_ValidationState<PackageValidationResult>,
                                     PCKG_POLICY,(string *)&err_string,(string *)&local_128);
                  pWVar27 = (pointer)(ulong)bVar8;
                  std::__cxx11::string::~string((string *)&local_128);
                  std::__cxx11::string::~string((string *)&effective_feerate_1);
                  std::__cxx11::string::~string((string *)&local_170);
                  psVar26 = (string *)&err_string;
LAB_0037c6de:
                  std::__cxx11::string::~string((string *)psVar26);
                }
              }
            }
            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&err);
            goto LAB_0037b4d4;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"package RBF failed: package must be 1-parent-1-child",
                     (allocator<char> *)&local_128);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_string,"",(allocator<char> *)&local_170);
          bVar8 = ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_POLICY,(string *)&err,(string *)&err_string);
          goto LAB_0037b4b7;
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
        pWVar13 = extraout_RDX_02;
      }
      goto LAB_0037b4fb;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"",(allocator<char> *)&local_128);
    ValidationState<PackageValidationResult>::Invalid
              (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
               (string *)&result,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&result);
    ValidationState<PackageValidationResult>::ValidationState
              (&local_6d0,&package_state.super_ValidationState<PackageValidationResult>);
    peVar4 = ((pWVar23[-1].m_ptx)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ValidationState<TxValidationResult>::ValidationState
              (&local_7f8,&placeholder_state.super_ValidationState<TxValidationResult>);
    CFeeRate::CFeeRate(&local_a10,&nFeePaid->m_total_modified_fees,
                       (uint32_t)(this_07->m_subpackage).m_total_vsize);
    state_05.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
    state_05.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         in_stack_fffffffffffff590;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         in_stack_fffffffffffff594;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_ =
         in_stack_fffffffffffff598;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_ =
         in_stack_fffffffffffff59c;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
    ._0_4_ = in_stack_fffffffffffff5a0;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
    ._4_4_ = in_stack_fffffffffffff5a4;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)nFeePaid;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_ =
         in_stack_fffffffffffff5b8;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_ =
         in_stack_fffffffffffff5bc;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = (size_type)args;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
         __return_storage_ptr__;
    MempoolAcceptResult::FeeFailure
              ((MempoolAcceptResult *)&err,state_05,(CFeeRate)&local_7f8,
               (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)local_a10.nSatoshisPerK);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
         *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    MempoolAcceptResult::MempoolAcceptResult
              ((MempoolAcceptResult *)
               ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20),
               (MempoolAcceptResult *)&err);
    __l._M_len = 1;
    __l._M_array = (iterator)&result;
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)&err_string,__l,(less<uint256> *)&local_128,(allocator_type *)&local_170);
    pVVar24 = &local_6d0;
    state_06.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c;
    state_06.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         in_stack_fffffffffffff590;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         in_stack_fffffffffffff594;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_ =
         in_stack_fffffffffffff598;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_ =
         in_stack_fffffffffffff59c;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = this_07;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)nFeePaid;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_ =
         in_stack_fffffffffffff5b8;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_ =
         in_stack_fffffffffffff5bc;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)args;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         __return_storage_ptr__;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state_06,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)pVVar24);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)&err_string);
    MempoolAcceptResult::~MempoolAcceptResult
              ((MempoolAcceptResult *)
               ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20));
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&err);
    ValidationState<TxValidationResult>::~ValidationState(&local_7f8);
    goto LAB_0037c09b;
  }
  ValidationState<PackageValidationResult>::ValidationState
            (&local_4a8,&package_state.super_ValidationState<PackageValidationResult>);
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
  state.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c;
  state.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
       in_stack_fffffffffffff590;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
       in_stack_fffffffffffff594;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_ =
       in_stack_fffffffffffff598;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_ =
       in_stack_fffffffffffff59c;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
  ._0_4_ = in_stack_fffffffffffff5a0;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
  ._4_4_ = in_stack_fffffffffffff5a4;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
       in_stack_fffffffffffff5a8;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)in_stack_fffffffffffff5b0;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_ =
       in_stack_fffffffffffff5b8;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_ =
       in_stack_fffffffffffff5bc;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_allocated_capacity
       = (size_type)args;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
       in_stack_fffffffffffff5c8;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
       super__Move_assign_alias<bilingual_str,_std::monostate>.
       super__Copy_assign_alias<bilingual_str,_std::monostate>.
       super__Move_ctor_alias<bilingual_str,_std::monostate>.
       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_;
  PackageMempoolAcceptResult::PackageMempoolAcceptResult
            (__return_storage_ptr__,state,
             (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)&local_4a8);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)&result);
  ValidationState<PackageValidationResult>::~ValidationState(&local_4a8);
  goto LAB_0037c0e6;
code_r0x0037b371:
  psVar7 = &pWVar13->m_ancestors;
  pWVar13 = pWVar13 + 1;
  if ((psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0037b382;
  goto LAB_0037b368;
LAB_0037b382:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"package RBF failed: new transaction cannot have mempool ancestors",
             (allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err_string,"",(allocator<char> *)&local_170);
  bVar8 = ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                     (string *)&err,(string *)&err_string);
LAB_0037b4b7:
  std::__cxx11::string::~string((string *)&err_string);
  this_04 = (string *)&err;
LAB_0037b4cf:
  pWVar27 = (pointer)(ulong)bVar8;
  std::__cxx11::string::~string(this_04);
LAB_0037b4d4:
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
  pWVar13 = extraout_RDX_03;
  pWVar23 = local_9e8.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pWVar17 = local_9e8.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)pWVar27 & 1) == 0) {
    pVVar24 = &local_840;
    ValidationState<PackageValidationResult>::ValidationState
              (pVVar24,&package_state.super_ValidationState<PackageValidationResult>);
    state_10.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c;
    state_10.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         in_stack_fffffffffffff590;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         in_stack_fffffffffffff594;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_ =
         in_stack_fffffffffffff598;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_ =
         in_stack_fffffffffffff59c;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = this_07;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)nFeePaid;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_ =
         height;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_ =
         uVar35;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)args;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         __return_storage_ptr__;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state_10,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)pVVar24);
  }
  else {
LAB_0037b4fb:
    replaced_txns = &(this_07->m_subpackage).m_replaced_transactions;
    for (pVVar15 = &(pWVar17->m_state).super_ValidationState<TxValidationResult>;
        pWVar17 = local_9e8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (pointer)&pVVar15[-3].m_reject_reason != pWVar23; pVVar15 = pVVar15 + 8) {
      pVVar15[-1].m_debug_message._M_string_length = package_feerate.nSatoshisPerK;
      bVar8 = PolicyScriptChecks(this_07,(ATMPArgs *)&pVVar15[-3].m_reject_reason,pWVar13);
      if (!bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&local_128);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&result);
        lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
        ValidationState<TxValidationResult>::ValidationState(&local_888,pVVar15);
        state_08.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
        state_08.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             in_stack_fffffffffffff590;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             in_stack_fffffffffffff594;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_ =
             in_stack_fffffffffffff598;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_ =
             in_stack_fffffffffffff59c;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)nFeePaid;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_ =
             height;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_ =
             uVar35;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_08);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        ValidationState<TxValidationResult>::~ValidationState(&local_888);
        pVVar24 = &local_8d0;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar24,&package_state.super_ValidationState<PackageValidationResult>);
        state_09.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c
        ;
        state_09.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = in_stack_fffffffffffff590;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = in_stack_fffffffffffff594;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = in_stack_fffffffffffff598;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = in_stack_fffffffffffff59c;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             this_07;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)nFeePaid;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = height;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = uVar35;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_09,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar24);
        goto LAB_0037c09b;
      }
      pWVar13 = extraout_RDX_04;
      if (args->m_test_accept == true) {
        if (args->m_package_feerates == true) {
          err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)pVVar15[-1].m_debug_message._M_string_length;
          bVar9 = 1;
        }
        else {
          CFeeRate::CFeeRate((CFeeRate *)&err_string,(CAmount *)&pVVar15[-1].m_debug_message,
                             *(uint32_t *)&pVVar15[-1].m_reject_reason.field_2);
          bVar9 = args->m_package_feerates;
        }
        if ((bVar9 & 1) == 0) {
          lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               *(undefined8 *)(lVar29 + 0x59);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
               *(undefined8 *)(lVar29 + 0x61);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
               *(undefined8 *)(lVar29 + 0x69);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
               *(undefined8 *)(lVar29 + 0x71);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&result;
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err,__l_00,(allocator_type *)&local_128);
        }
        else {
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err,&all_package_wtxids);
        }
        lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)&result,replaced_txns,
                   pVVar15[-1].m_reject_reason.field_2._M_allocated_capacity,
                   *(CAmount *)((long)&pVVar15[-1].m_reject_reason.field_2 + 8),
                   (CFeeRate)
                   err_string.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        std::
        _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
        ~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)&err);
        pWVar13 = extraout_RDX_05;
      }
    }
    if (args->m_test_accept == true) {
      pVVar24 = &local_918;
      ValidationState<PackageValidationResult>::ValidationState
                (pVVar24,&package_state.super_ValidationState<PackageValidationResult>);
      state_07.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c;
      state_07.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
           = in_stack_fffffffffffff590;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
           = in_stack_fffffffffffff594;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_
           = in_stack_fffffffffffff598;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_
           = in_stack_fffffffffffff59c;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
           this_07;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)nFeePaid;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_4_
           = height;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_4_
           = uVar35;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)args;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           __return_storage_ptr__;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_07,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)pVVar24);
    }
    else {
      lVar18 = (long)local_9e8.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_9e8.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      limits = (Limits *)0x240;
      __it._M_current =
           local_9e8.
           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pWVar13 = local_9e8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = this_07;
      for (lVar29 = lVar18 / 0x240 >> 2; _Var33._M_current = __it._M_current, 0 < lVar29;
          lVar29 = lVar29 + -1) {
        bVar8 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it);
        pWVar22 = extraout_RDX_06;
        if (bVar8) goto LAB_0037b8ee;
        bVar8 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it._M_current + 1);
        pWVar22 = extraout_RDX_07;
        _Var33._M_current = __it._M_current + 1;
        if (bVar8) goto LAB_0037b8ee;
        bVar8 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it._M_current + 2);
        pWVar22 = extraout_RDX_08;
        _Var33._M_current = __it._M_current + 2;
        if (bVar8) goto LAB_0037b8ee;
        bVar8 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it._M_current + 3);
        pWVar22 = extraout_RDX_09;
        _Var33._M_current = __it._M_current + 3;
        if (bVar8) goto LAB_0037b8ee;
        __it._M_current = __it._M_current + 4;
        lVar18 = lVar18 + -0x900;
      }
      limits = (Limits *)0x240;
      lVar29 = lVar18 / 0x240;
      pWVar22 = (Workspace *)(lVar18 % 0x240);
      if (lVar29 == 1) {
LAB_0037b8d3:
        bVar8 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it);
        pWVar22 = extraout_RDX_12;
        _Var33._M_current = __it._M_current;
        if (!bVar8) {
          _Var33._M_current = pWVar13;
        }
LAB_0037b8ee:
        if (_Var33._M_current != pWVar13) {
          __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ,0x54b,
                        "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                       );
        }
      }
      else {
        if (lVar29 == 2) {
LAB_0037b8b8:
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                                *)&result,__it);
          pWVar22 = extraout_RDX_11;
          _Var33._M_current = __it._M_current;
          if (!bVar8) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0037b8d3;
          }
          goto LAB_0037b8ee;
        }
        if (lVar29 == 3) {
          bVar8 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                                *)&result,__it);
          pWVar22 = extraout_RDX_10;
          if (!bVar8) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0037b8b8;
          }
          goto LAB_0037b8ee;
        }
      }
      bVar8 = true;
      for (pVVar15 = &(pWVar17->m_state).super_ValidationState<TxValidationResult>;
          pWVar12 = local_9e8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          pWVar17 = local_9e8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          psVar26 = &pVVar15[-3].m_reject_reason, (Workspace *)psVar26 != pWVar13;
          pVVar15 = pVVar15 + 8) {
        bVar10 = ConsensusScriptChecks(this_07,(ATMPArgs *)psVar26,pWVar22);
        if (!bVar10) {
          lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState
                    ((ValidationState<TxValidationResult> *)&err,pVVar15);
          state_11.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
          state_11.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
               = in_stack_fffffffffffff590;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
               = in_stack_fffffffffffff594;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_
               = in_stack_fffffffffffff598;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_
               = in_stack_fffffffffffff59c;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07
          ;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)pWVar13;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_
               = height;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_
               = uVar35;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)args;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               __return_storage_ptr__;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_11);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState
                    ((ValidationState<TxValidationResult> *)&err);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&err_string,
                     (base_blob<256u> *)(**(long **)&pVVar15[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,
                     (tinyformat *)
                     "BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s",
                     (char *)&err_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&effective_feerate_1,"",(allocator<char> *)&local_78);
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&effective_feerate_1);
          std::__cxx11::string::~string((string *)&effective_feerate_1);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&err_string);
          bVar8 = false;
        }
        limits = &(this_07->m_pool->m_opts).limits;
        CTxMemPool::CalculateMemPoolAncestors
                  ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                    *)&err_string,this_07->m_pool,
                   (CTxMemPoolEntry *)pVVar15[-1].m_reject_reason._M_dataplus._M_p,limits,true);
        if (local_a0 != '\x01') {
          lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_128,pVVar15);
          state_12.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
          state_12.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
               = in_stack_fffffffffffff590;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
               = in_stack_fffffffffffff594;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_
               = in_stack_fffffffffffff598;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_
               = in_stack_fffffffffffff59c;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07
          ;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)pWVar13;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_
               = height;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_
               = uVar35;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)args;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               __return_storage_ptr__;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_12);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_128);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&effective_feerate_1,
                     (base_blob<256u> *)(**(long **)&pVVar15[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,
                     (tinyformat *)"BUG! Mempool ancestors or descendants were underestimated: %s",
                     (char *)&effective_feerate_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"",(allocator<char> *)&local_98);
          limits = &local_78;
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&effective_feerate_1);
          bVar8 = false;
        }
        this_06 = (_Rb_tree<_270907ca_> *)((long)&pVVar15[-2].m_reject_reason.field_2 + 8);
        util::
        Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
        ::
        value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
                  ((T *)&result,
                   (_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                    *)&err_string,
                   (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    *)this_06);
        std::_Rb_tree<$270907ca$>::operator=(this_06,(_Rb_tree<_270907ca_> *)&result);
        std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&result);
        std::__detail::__variant::
        _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                             *)&err_string);
        bVar10 = Finalize(this_07,args,(Workspace *)psVar26);
        pWVar22 = extraout_RDX_13;
        if (!bVar10) {
          lVar29 = **(long **)&pVVar15[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_170,pVVar15);
          state_13.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff58c;
          state_13.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff588;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_
               = in_stack_fffffffffffff590;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_
               = in_stack_fffffffffffff594;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_
               = in_stack_fffffffffffff598;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_
               = in_stack_fffffffffffff59c;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = this_07
          ;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)pWVar13;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._0_4_
               = height;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length._4_4_
               = uVar35;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)args;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               __return_storage_ptr__;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_13);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar29 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_170);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&err_string,
                     (base_blob<256u> *)(**(long **)&pVVar15[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,(tinyformat *)"BUG! Adding to mempool failed: %s",
                     (char *)&err_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&effective_feerate_1,"",(allocator<char> *)&local_78);
          limits = (Limits *)&effective_feerate_1;
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&effective_feerate_1);
          std::__cxx11::string::~string((string *)&effective_feerate_1);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&err_string);
          bVar8 = false;
          pWVar22 = extraout_RDX_14;
        }
      }
      all_package_wtxids_1.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_package_wtxids_1.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_package_wtxids_1.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n_00 = (pointer)(((long)local_9e8.
                                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_9e8.
                               super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x240);
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      reserve(&all_package_wtxids_1,(size_type)__n_00);
      for (pWVar27 = pWVar17; pWVar27 != pWVar12; pWVar27 = pWVar27 + 1) {
        peVar4 = (pWVar27->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
        ;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
              );
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
              );
        std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
        emplace_back<transaction_identifier<true>>
                  ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                    *)&all_package_wtxids_1,(transaction_identifier<true> *)&result);
      }
      pMVar34 = this_07;
      if (((replaced_txns->
           super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)replaced_txns) &&
         (bVar10 = ::LogAcceptCategory(MEMPOOL,Debug), pMVar34 = this_07, bVar10)) {
        local_1b8._M_dataplus._M_p =
             (pointer)(this_07->m_subpackage).m_replaced_transactions.
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl._M_node._M_size;
        parent_feerate.nSatoshisPerK =
             (this_07->m_subpackage).m_total_modified_fees -
             (this_07->m_subpackage).m_conflicting_fees;
        package_feerate_1.nSatoshisPerK =
             (this_07->m_subpackage).m_total_vsize -
             (long)(int)(this_07->m_subpackage).m_conflicting_size;
        local_1d8._M_dataplus._M_p = __n_00;
        pLVar19 = LogInstance();
        bVar10 = BCLog::Logger::Enabled(pLVar19);
        if (bVar10) {
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ = 0;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
               result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ &
               0xffffffffffffff00;
          tinyformat::format<unsigned_long,unsigned_long,long,long>
                    ((string *)&err_string,
                     (tinyformat *)
                     "replaced %u mempool transactions with %u new one(s) for %s additional fees, %d delta bytes\n"
                     ,(char *)&local_1b8,(unsigned_long *)&local_1d8,
                     (unsigned_long *)&parent_feerate,&package_feerate_1.nSatoshisPerK,
                     (long *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_string);
          std::__cxx11::string::~string((string *)&err_string);
          pLVar19 = LogInstance();
          err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x57;
          err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = (size_type)anon_var_dwarf_bf6ded;
          in_stack_fffffffffffff588 = 0x57;
          in_stack_fffffffffffff58c = 0;
          in_stack_fffffffffffff590 = 0x6d76f9;
          in_stack_fffffffffffff594 = 0;
          in_stack_fffffffffffff5a0 = 1;
          in_stack_fffffffffffff598 = 4;
          in_stack_fffffffffffff59c = 0;
          source_file._M_str._0_4_ = 0x6d76f9;
          source_file._M_len = 0x57;
          source_file._M_str._4_4_ = 0;
          str._M_str = (char *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _0_8_;
          str._M_len = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_;
          logging_function._M_str = "SubmitPackage";
          logging_function._M_len = 0xd;
          BCLog::Logger::LogPrintStr(pLVar19,str,logging_function,source_file,0x584,MEMPOOL,Debug);
          std::__cxx11::string::~string((string *)&result);
          pWVar17 = local_9e8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pWVar12 = local_9e8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      while( true ) {
        if (pWVar17 == pWVar12) break;
        if (args->m_package_feerates == true) {
          effective_feerate_1.nSatoshisPerK = (pWVar17->m_package_feerate).nSatoshisPerK;
          bVar9 = 1;
        }
        else {
          CFeeRate::CFeeRate(&effective_feerate_1,&pWVar17->m_modified_fees,
                             (uint32_t)pWVar17->m_vsize);
          bVar9 = args->m_package_feerates;
        }
        if ((bVar9 & 1) == 0) {
          peVar4 = (pWVar17->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               *(undefined8 *)
                (peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
          ;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                0x10);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                0x18);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&result;
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err_string,__l_01,(allocator_type *)&local_78);
        }
        else {
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err_string,&all_package_wtxids_1);
        }
        peVar4 = (pWVar17->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)&result,replaced_txns,pWVar17->m_vsize,
                   pWVar17->m_base_fees,effective_feerate_1,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err_string);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,&peVar4->m_witness_hash,(MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        if ((this_07->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
          tx = pWVar17->m_ptx;
          tx_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar5 = pWVar17->m_vsize;
          height = ((pWVar17->m_entry)._M_t.
                    super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                    .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl)->entryHeight;
          bVar10 = args->m_bypass_limits;
          submitted_in_package = args->m_package_submission;
          chainstate_is_current = IsCurrentForFeeEstimation(this_07->m_active_chainstate);
          has_no_mempool_parents = CTxMemPool::HasNoInputsOf(pMVar34->m_pool,tx_00);
          in_stack_fffffffffffff598 = (uint)has_no_mempool_parents;
          in_stack_fffffffffffff590 = (uint)chainstate_is_current;
          in_stack_fffffffffffff588 = (uint)submitted_in_package;
          this_07 = pMVar34;
          NewMempoolTransactionInfo::NewMempoolTransactionInfo
                    ((NewMempoolTransactionInfo *)&result,tx,&pWVar17->m_base_fees,iVar5,height,
                     bVar10,submitted_in_package,chainstate_is_current,has_no_mempool_parents);
          pCVar6 = this_07->m_pool;
          mempool_sequence = pCVar6->m_sequence_number;
          this_01 = (pCVar6->m_opts).signals;
          pCVar6->m_sequence_number = mempool_sequence + 1;
          pMVar34 = this_07;
          ValidationSignals::TransactionAddedToMempool
                    (this_01,(NewMempoolTransactionInfo *)&result,mempool_sequence);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8));
          pWVar13 = pWVar17;
        }
        std::
        _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
        ~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)&err_string);
        pWVar17 = pWVar17 + 1;
      }
      std::
      _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      ~_Vector_base(&all_package_wtxids_1.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   );
      if (bVar8) {
        pVVar24 = &local_9a8;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar24,&package_state.super_ValidationState<PackageValidationResult>);
        state_14.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c
        ;
        state_14.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = in_stack_fffffffffffff590;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = in_stack_fffffffffffff594;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = in_stack_fffffffffffff598;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = in_stack_fffffffffffff59c;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             pMVar34;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pWVar13;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = height;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = uVar35;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_14,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar24);
      }
      else {
        pVVar24 = &local_960;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar24,&package_state.super_ValidationState<PackageValidationResult>);
        state_15.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff58c
        ;
        state_15.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff588;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _0_4_ = in_stack_fffffffffffff590;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p.
        _4_4_ = in_stack_fffffffffffff594;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = in_stack_fffffffffffff598;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = in_stack_fffffffffffff59c;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5a0;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5a4;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             pMVar34;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pWVar13;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _0_4_ = height;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length.
        _4_4_ = uVar35;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)args;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             __return_storage_ptr__;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_15,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar24);
      }
    }
  }
LAB_0037c09b:
  ValidationState<PackageValidationResult>::~ValidationState(pVVar24);
  ValidationState<TxValidationResult>::~ValidationState
            (&placeholder_state.super_ValidationState<TxValidationResult>);
  std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
  ~_Vector_base(&all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               );
LAB_0037c0bf:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&results._M_t);
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::~vector(&local_9e8);
LAB_0037c0e6:
  ValidationState<PackageValidationResult>::~ValidationState
            (&package_state.super_ValidationState<PackageValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
LAB_0037d2dc:
  __stack_chk_fail();
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}